

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O0

parser_error parse_curse_type(parser *p)

{
  wchar_t wVar1;
  char *name;
  void *pvVar2;
  curse *curse;
  wchar_t tval;
  parser *p_local;
  
  name = parser_getsym(p,"tval");
  wVar1 = tval_find_idx(name);
  pvVar2 = parser_priv(p);
  if (pvVar2 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else if ((wVar1 < L'\0') || (L'#' < wVar1)) {
    p_local._4_4_ = PARSE_ERROR_UNRECOGNISED_TVAL;
  }
  else {
    *(undefined1 *)(*(long *)((long)pvVar2 + 0x10) + (long)wVar1) = 1;
    p_local._4_4_ = PARSE_ERROR_NONE;
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_curse_type(struct parser *p) {
	int tval = tval_find_idx(parser_getsym(p, "tval"));
	struct curse *curse = parser_priv(p);

	if (!curse) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	if ((tval < 0) || (tval >= TV_MAX)) {
		return PARSE_ERROR_UNRECOGNISED_TVAL;
	}
	curse->poss[tval] = true;
	return PARSE_ERROR_NONE;
}